

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
EnsureArray(List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *this,int32 requiredCapacity)

{
  int left;
  unsigned_long *src;
  bool bVar1;
  Type *pTVar2;
  int32 local_2c;
  int32 local_28;
  int32 newBufferSize;
  int32 oldBufferSize;
  int32 newLength;
  
  if ((this->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer ==
      (Type)0x0) {
    if (requiredCapacity < this->increment) {
      requiredCapacity = this->increment;
    }
    pTVar2 = AllocArray(this,requiredCapacity);
    (this->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer =
         pTVar2;
    (this->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count = 0;
    this->length = requiredCapacity;
    return;
  }
  left = this->length;
  if ((this->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).count ==
      left || left < requiredCapacity) {
    newBufferSize = 0;
    local_2c = 0;
    local_28 = 0;
    bVar1 = Int32Math::Add(left,1,&newBufferSize);
    if ((bVar1) || (bVar1 = Int32Math::Shl(newBufferSize,1,&newBufferSize), bVar1)) {
      ExternalApi::RaiseOnIntOverflow();
    }
    if (requiredCapacity < newBufferSize) {
      requiredCapacity = newBufferSize;
    }
    newBufferSize = requiredCapacity;
    bVar1 = Int32Math::Mul(8,requiredCapacity,&local_2c);
    if ((bVar1) || (bVar1 = Int32Math::Mul(8,this->length,&local_28), bVar1)) {
      ExternalApi::RaiseOnIntOverflow();
    }
    pTVar2 = AllocArray(this,newBufferSize);
    src = (this->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer;
    Memory::CopyArray<unsigned_long,unsigned_long,Memory::HeapAllocator>
              (pTVar2,(long)newBufferSize,src,(long)this->length);
    Memory::HeapAllocator::Free
              ((this->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).
               alloc,src,(long)local_28);
    this->length = newBufferSize;
    (this->super_ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>).buffer =
         pTVar2;
    return;
  }
  return;
}

Assistant:

void EnsureArray(DECLSPEC_GUARD_OVERFLOW int32 requiredCapacity)
        {
            if (this->buffer == nullptr)
            {
                int32 newSize = max(requiredCapacity, increment);

                this->buffer = AllocArray(newSize);
                this->count = 0;
                this->length = newSize;
            }
            else if (this->count == length || requiredCapacity > this->length)
            {
                int32 newLength = 0, newBufferSize = 0, oldBufferSize = 0;

                if (Int32Math::Add(length, 1u, &newLength)
                    || Int32Math::Shl(newLength, 1u, &newLength))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                newLength = max(requiredCapacity, newLength);

                if (Int32Math::Mul(sizeof(T), newLength, &newBufferSize)
                    || Int32Math::Mul(sizeof(T), length, &oldBufferSize))
                {
                    JsUtil::ExternalApi::RaiseOnIntOverflow();
                }

                Field(T, TAllocator)* newbuffer = AllocArray(newLength);
                Field(T, TAllocator)* oldbuffer = this->buffer;
                CopyArray<Field(T, TAllocator), Field(T, TAllocator), EffectiveAllocatorType>(
                    newbuffer, newLength, oldbuffer, length);

                FreeArray(oldbuffer, oldBufferSize);

                this->length = newLength;
                this->buffer = newbuffer;
            }
        }